

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O0

void google::protobuf::internal::UnknownFieldSerializerLite
               (uint8_t *ptr,uint32_t offset,uint32_t param_3,uint32_t param_4,
               CodedOutputStream *output)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str;
  CodedOutputStream *output_local;
  uint32_t param_3_local;
  uint32_t param_2_local;
  uint32_t offset_local;
  uint8_t *ptr_local;
  
  str = InternalMetadata::unknown_fields<std::__cxx11::string>
                  ((InternalMetadata *)(ptr + offset),GetEmptyString_abi_cxx11_);
  io::CodedOutputStream::WriteString(output,str);
  return;
}

Assistant:

void UnknownFieldSerializerLite(const uint8_t* ptr, uint32_t offset,
                                uint32_t /*tag*/, uint32_t /*has_offset*/,
                                io::CodedOutputStream* output) {
  output->WriteString(
      reinterpret_cast<const InternalMetadata*>(ptr + offset)
          ->unknown_fields<std::string>(&internal::GetEmptyString));
}